

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

bool idx2::ToInt(stref *Str,int *Result)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int I;
  int iVar6;
  power<int,_10> local_39;
  int *local_38;
  
  if (((Str->field_0).Ptr == (char *)0x0) || (I = 0, Str->Size < 1)) {
    bVar4 = false;
  }
  else {
    cVar1 = *(Str->field_0).Ptr;
    *Result = 0;
    iVar6 = -1;
    local_38 = Result;
    while( true ) {
      iVar3 = Str->Size;
      iVar5 = iVar3 - (uint)(cVar1 == '-');
      bVar4 = iVar5 <= I;
      if (iVar5 <= I) break;
      if (iVar3 <= iVar6 + iVar3) {
        __assert_fail("Idx < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                      ,0x9b,"char &idx2::stref::operator[](int) const");
      }
      bVar2 = (Str->field_0).Ptr[iVar6 + iVar3];
      if (9 < (byte)(bVar2 - 0x30)) {
        return bVar4;
      }
      iVar5 = power<int,_10>::operator[](&local_39,I);
      iVar5 = iVar5 * (bVar2 - 0x30);
      iVar3 = -iVar5;
      if (cVar1 != '-') {
        iVar3 = iVar5;
      }
      *local_38 = *local_38 + iVar3;
      I = I + 1;
      iVar6 = iVar6 + -1;
    }
  }
  return bVar4;
}

Assistant:

bool
ToInt(const stref& Str, int* Result)
{
  stref& StrR = const_cast<stref&>(Str);
  if (!StrR || StrR.Size <= 0)
    return false;

  int Mult = 1, Start = 0;
  if (StrR[0] == '-')
  {
    Mult = -1;
    Start = 1;
  }
  *Result = 0;
  for (int I = 0; I < Str.Size - Start; ++I)
  {
    int V = StrR[StrR.Size - I - 1] - '0';
    if (V >= 0 && V < 10)
      *Result += Mult * (V * power<int, 10>()[I]);
    else
      return false;
  }
  return true;
}